

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_compress_3d.cpp
# Opt level: O3

size_t prediction_and_quantization_3d<float>
                 (float *data,DSize_3d *size,meanInfo<float> *mean_info,double precision,
                 int capacity,int intv_radius,uchar *indicator,int *type,int *reg_params_type,
                 float **reg_unpredictable_data_pos,float **unpredictable_data_pos)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  size_t sVar7;
  size_t sVar8;
  int size_x;
  int size_y;
  int size_z;
  int i;
  int iVar9;
  undefined8 *__ptr;
  void *__ptr_00;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  float *pfVar21;
  float *pfVar22;
  float *data_pos;
  float *pfVar23;
  int j;
  long lVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  int *piVar28;
  float *reg_params_pos;
  long lVar29;
  float *pfVar30;
  float fVar31;
  float fVar32;
  double dVar33;
  float fVar34;
  double dVar35;
  double reg_precisions [4];
  float *local_138;
  size_t local_130;
  int *local_f0;
  double local_58 [5];
  
  __ptr = (undefined8 *)malloc(size->num_blocks * 0x10 + 0x10);
  *__ptr = 0;
  __ptr[1] = 0;
  iVar9 = size->block_size;
  lVar29 = (long)iVar9;
  fVar31 = (float)(precision * 0.1 * 0.25);
  local_58[3] = (double)fVar31;
  local_58[0] = (double)(fVar31 / (float)iVar9);
  lVar1 = lVar29 + 1;
  iVar12 = (int)lVar1;
  uVar27 = (ulong)(uint)(iVar12 * iVar12);
  local_58[1] = local_58[0];
  local_58[2] = local_58[0];
  __ptr_00 = calloc(1,(long)(iVar12 * iVar12 * iVar12) << 2);
  uVar13 = size->num_x;
  if (uVar13 == 0) {
    local_130 = 0;
  }
  else {
    local_f0 = reg_params_type;
    reg_params_pos = (float *)(__ptr + 2);
    iVar12 = capacity + -2;
    if (mean_info->use_mean == false) {
      iVar12 = capacity;
    }
    uVar11 = size->num_y;
    lVar5 = lVar29 * 4 + 4;
    local_130 = 0;
    uVar16 = uVar11;
    uVar20 = 0;
    local_138 = data;
    do {
      uVar2 = uVar20 + 1;
      if (uVar16 == 0) {
        uVar16 = 0;
      }
      else {
        uVar13 = size->num_z;
        uVar16 = 0;
        pfVar22 = local_138;
        do {
          uVar3 = uVar16 + 1;
          if (uVar13 == 0) {
            uVar13 = 0;
          }
          else {
            uVar11 = 0;
            data_pos = pfVar22;
            do {
              iVar9 = size->block_size;
              lVar24 = (long)iVar9;
              size_x = (int)size->d1 - (int)uVar20 * iVar9;
              if (uVar2 * lVar24 < size->d1) {
                size_x = iVar9;
              }
              size_y = (int)size->d2 - (int)uVar16 * iVar9;
              if (uVar3 * lVar24 < size->d2) {
                size_y = iVar9;
              }
              uVar4 = uVar11 + 1;
              size_z = (int)size->d3 - (int)uVar11 * iVar9;
              if (lVar24 * uVar4 < size->d3) {
                size_z = iVar9;
              }
              iVar9 = size_y;
              if (size_x < size_y) {
                iVar9 = size_x;
              }
              if (size_z <= iVar9) {
                iVar9 = size_z;
              }
              if (iVar9 < 4) {
                *indicator = '\0';
LAB_00104408:
                if (0 < size_x) {
                  sVar7 = size->dim0_offset;
                  sVar8 = size->dim1_offset;
                  iVar9 = 0;
                  pfVar21 = data_pos;
                  lVar24 = (long)__ptr_00 + lVar1 * 4 + uVar27 * 4 + 4;
                  do {
                    if (0 < size_y) {
                      bVar6 = mean_info->use_mean;
                      lVar25 = lVar24 + ~(lVar29 + uVar27) * 4;
                      lVar10 = uVar27 * -4 + lVar24;
                      lVar18 = lVar24 + (lVar29 * 4 ^ 0xfffffffffffffffcU);
                      iVar19 = 0;
                      pfVar23 = *unpredictable_data_pos;
                      do {
                        pfVar14 = pfVar23;
                        if (0 < size_z) {
                          lVar15 = 0;
                          iVar26 = size_z;
                          do {
                            fVar31 = *(float *)((long)pfVar21 + lVar15);
                            if (((bVar6 & 1U) == 0) ||
                               (fVar32 = mean_info->mean, precision <= (double)ABS(fVar31 - fVar32))
                               ) {
                              fVar32 = ((((*(float *)(lVar24 + -4 + lVar15) +
                                           *(float *)(lVar18 + lVar15) + *(float *)(lVar10 + lVar15)
                                          ) - *(float *)(lVar18 + -4 + lVar15)) -
                                        *(float *)(lVar10 + -4 + lVar15)) -
                                       *(float *)(lVar25 + lVar15)) +
                                       *(float *)(lVar25 + -4 + lVar15);
                              fVar34 = fVar31 - fVar32;
                              dVar33 = (double)ABS(fVar34) / precision + 1.0;
                              if ((double)iVar12 <= dVar33) {
LAB_00104596:
                                *(float *)(lVar24 + lVar15) = fVar31;
                                pfVar14 = pfVar23 + 1;
                                *unpredictable_data_pos = pfVar14;
                                *pfVar23 = fVar31;
                                iVar17 = 0;
                                pfVar23 = pfVar14;
                              }
                              else {
                                if (fVar34 <= 0.0) {
                                  dVar33 = -dVar33;
                                }
                                fVar32 = (float)((double)((int)(dVar33 * 0.5) * 2) * precision +
                                                (double)fVar32);
                                *(float *)(lVar24 + lVar15) = fVar32;
                                if (precision < (double)ABS(fVar32 - fVar31)) goto LAB_00104596;
                                iVar17 = (int)(dVar33 * 0.5) + intv_radius;
                              }
                              *(int *)((long)type + lVar15) = iVar17;
                            }
                            else {
                              *(undefined4 *)((long)type + lVar15) = 1;
                              *(float *)(lVar24 + lVar15) = fVar32;
                            }
                            lVar15 = lVar15 + 4;
                            iVar26 = iVar26 + -1;
                          } while (iVar26 != 0);
                          type = (int *)((long)type + lVar15);
                          pfVar21 = (float *)((long)pfVar21 + lVar15);
                        }
                        lVar24 = lVar24 + lVar5;
                        pfVar21 = pfVar21 + (sVar8 - (long)size_z);
                        iVar19 = iVar19 + 1;
                        lVar25 = lVar25 + lVar5;
                        lVar10 = lVar10 + lVar5;
                        lVar18 = lVar18 + lVar5;
                        pfVar23 = pfVar14;
                      } while (iVar19 != size_y);
                    }
                    lVar24 = lVar24 + (uVar27 - size_y * lVar1) * 4;
                    pfVar21 = pfVar21 + (sVar7 - sVar8 * (long)size_y);
                    iVar9 = iVar9 + 1;
                  } while (iVar9 != size_x);
                }
              }
              else {
                compute_regression_coeffcients_3d<float>
                          (data_pos,size_x,size_y,size_z,size->dim0_offset,size->dim1_offset,
                           reg_params_pos);
                iVar9 = sz_blockwise_selection_3d<float>
                                  (data_pos,mean_info,size->dim0_offset,size->dim1_offset,iVar9,
                                   (float)(precision * 1.22),reg_params_pos);
                *indicator = (uchar)iVar9;
                if ((uchar)iVar9 == '\0') goto LAB_00104408;
                pfVar21 = *reg_unpredictable_data_pos;
                lVar24 = 0;
                do {
                  fVar31 = reg_params_pos[lVar24];
                  dVar33 = local_58[lVar24];
                  fVar32 = fVar31 - reg_params_pos[lVar24 + -4];
                  dVar35 = (double)ABS(fVar32) / dVar33 + 1.0;
                  if (65536.0 <= dVar35) {
LAB_00104242:
                    reg_params_pos[lVar24] = fVar31;
                    *reg_unpredictable_data_pos = pfVar21 + 1;
                    *pfVar21 = fVar31;
                    iVar9 = 0;
                    pfVar21 = pfVar21 + 1;
                  }
                  else {
                    if (fVar32 <= 0.0) {
                      dVar35 = -dVar35;
                    }
                    fVar32 = (float)((double)((int)(dVar35 * 0.5) * 2) * dVar33 +
                                    (double)reg_params_pos[lVar24 + -4]);
                    reg_params_pos[lVar24] = fVar32;
                    if (dVar33 < (double)ABS(fVar32 - fVar31)) goto LAB_00104242;
                    iVar9 = (int)(dVar35 * 0.5) + 0x8000;
                  }
                  local_f0[lVar24] = iVar9;
                  lVar24 = lVar24 + 1;
                } while (lVar24 != 4);
                sVar7 = size->dim0_offset;
                sVar8 = size->dim1_offset;
                iVar9 = 0;
                pfVar21 = *unpredictable_data_pos;
                pfVar23 = data_pos;
                do {
                  iVar19 = 0;
                  pfVar14 = pfVar21;
                  do {
                    pfVar30 = pfVar23;
                    piVar28 = type;
                    lVar24 = 0;
                    lVar25 = 0;
                    do {
                      fVar32 = (float)(int)lVar25 * reg_params_pos[2] +
                               *reg_params_pos * (float)iVar9 + reg_params_pos[1] * (float)iVar19 +
                               reg_params_pos[3];
                      fVar31 = pfVar30[lVar25];
                      fVar34 = fVar31 - fVar32;
                      dVar33 = (double)ABS(fVar34) / precision + 1.0;
                      if ((double)capacity <= dVar33) {
LAB_00104385:
                        pfVar14 = pfVar21 + 1;
                        *unpredictable_data_pos = pfVar14;
                        *pfVar21 = fVar31;
                        iVar26 = 0;
                        pfVar21 = pfVar14;
                      }
                      else {
                        if (fVar34 <= 0.0) {
                          dVar33 = -dVar33;
                        }
                        if (precision <
                            (double)ABS((float)((double)((int)(dVar33 * 0.5) * 2) * precision +
                                               (double)fVar32) - fVar31)) goto LAB_00104385;
                        iVar26 = (int)(dVar33 * 0.5) + intv_radius;
                      }
                      piVar28[lVar25] = iVar26;
                      lVar25 = lVar25 + 1;
                      lVar24 = lVar24 + -4;
                    } while (size_z != (int)lVar25);
                    iVar19 = iVar19 + 1;
                    type = (int *)((long)piVar28 - lVar24);
                    pfVar23 = (float *)((long)pfVar30 + ((sVar8 * 4 + (long)size_z * -4) - lVar24));
                  } while (iVar19 != size_y);
                  pfVar23 = (float *)((long)pfVar30 +
                                     ((((long)size_y * -4 + 4) * sVar8 + sVar7 * 4 +
                                      (long)size_z * -4) - lVar24));
                  iVar9 = iVar9 + 1;
                  type = (int *)((long)piVar28 - lVar24);
                  pfVar21 = pfVar14;
                } while (iVar9 != size_x);
                local_130 = local_130 + 1;
                reg_params_pos = reg_params_pos + 4;
                local_f0 = local_f0 + 4;
                type = (int *)((long)piVar28 - lVar24);
              }
              indicator = indicator + 1;
              data_pos = data_pos + size_z;
              uVar13 = size->num_z;
              uVar11 = uVar4;
            } while (uVar4 < uVar13);
            iVar9 = size->block_size;
            uVar11 = size->num_y;
          }
          pfVar22 = pfVar22 + (long)iVar9 * size->dim1_offset;
          uVar16 = uVar3;
        } while (uVar3 < uVar11);
        uVar13 = size->num_x;
        uVar16 = uVar11;
      }
      local_138 = local_138 + (long)iVar9 * size->dim0_offset;
      uVar20 = uVar2;
    } while (uVar2 < uVar13);
  }
  free(__ptr_00);
  free(__ptr);
  return local_130;
}

Assistant:

size_t
prediction_and_quantization_3d(const T * data, const DSize_3d& size, const meanInfo<T>& mean_info, double precision,
	int capacity, int intv_radius, unsigned char * indicator, int * type, 
	int * reg_params_type, float *& reg_unpredictable_data_pos, T *& unpredictable_data_pos){
	const float noise = precision * LorenzeNoise3d;
	int * type_pos = type;
	unsigned char * indicator_pos = indicator;
	float * reg_params = (float *) malloc(RegCoeffNum3d * (size.num_blocks+1) * sizeof(float));
	for(int i=0; i<RegCoeffNum3d; i++)
		reg_params[i] = 0;
	float * reg_params_pos = reg_params + RegCoeffNum3d;
	int * reg_params_type_pos = reg_params_type;
	double reg_precisions[RegCoeffNum3d];
	float rel_param_err = RegErrThreshold * precision / RegCoeffNum3d;
	for(int i=0; i<RegCoeffNum3d-1; i++) 
		reg_precisions[i] = rel_param_err / size.block_size;
	reg_precisions[RegCoeffNum3d - 1] = rel_param_err;
	size_t buffer_dim0_offset = (size.block_size + 1) * (size.block_size + 1);
	size_t buffer_dim1_offset = size.block_size + 1;
	T * pred_buffer = (T *) malloc((size.block_size+1)*(size.block_size+1)*(size.block_size+1)*sizeof(T));
	memset(pred_buffer, 0, (size.block_size+1)*(size.block_size+1)*(size.block_size+1)*sizeof(T));
	size_t reg_count = 0;
	int capacity_lorenzo = mean_info.use_mean ? capacity - 2 : capacity;
	const T * x_data_pos = data;
	for(size_t i=0; i<size.num_x; i++){
		const T * y_data_pos = x_data_pos;
		for(size_t j=0; j<size.num_y; j++){
			const T * z_data_pos = y_data_pos;
			for(size_t k=0; k<size.num_z; k++){
				int size_x = ((i+1)*size.block_size < size.d1) ? size.block_size : size.d1 - i*size.block_size;
				int size_y = ((j+1)*size.block_size < size.d2) ? size.block_size : size.d2 - j*size.block_size;
				int size_z = ((k+1)*size.block_size < size.d3) ? size.block_size : size.d3 - k*size.block_size;
				int min_size = MIN(size_x, size_y);
				min_size = MIN(min_size, size_z);
				// size of block is less than some threshold
				if(min_size < RegThresholdSize3d){
					*indicator_pos = 0;
				}
				else{
					compute_regression_coeffcients_3d(z_data_pos, size_x, size_y, size_z, size.dim0_offset, size.dim1_offset, reg_params_pos);
					*indicator_pos = sz_blockwise_selection_3d(z_data_pos, mean_info, size.dim0_offset, size.dim1_offset, min_size, noise, reg_params_pos);
				}
				if(*indicator_pos){
					// regression
					compress_regression_coefficient_3d(reg_precisions, reg_params_pos, reg_params_type_pos, reg_unpredictable_data_pos);
					block_pred_and_quant_regression_3d(z_data_pos, reg_params_pos, precision, capacity, intv_radius, 
						size_x, size_y, size_z, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
					reg_count ++;
					reg_params_pos += RegCoeffNum3d;
					reg_params_type_pos += RegCoeffNum3d;
				}
				else{
					// Lorenzo
					block_pred_and_quant_lorenzo_3d(mean_info, z_data_pos, pred_buffer, precision, capacity_lorenzo, intv_radius, 
						size_x, size_y, size_z, buffer_dim0_offset, buffer_dim1_offset, size.dim0_offset, size.dim1_offset, type_pos, unpredictable_data_pos);
				}
				indicator_pos ++;
				z_data_pos += size_z;
			}
			y_data_pos += size.block_size*size.dim1_offset;
		}
		x_data_pos += size.block_size*size.dim0_offset;
	}
	free(pred_buffer);
	free(reg_params);
	return reg_count;
}